

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
emplaceRealloc<slang::ast::StreamingConcatenationExpression::StreamExpression>
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          pointer pos,StreamExpression *args)

{
  ulong uVar1;
  pointer p;
  Expression *pEVar2;
  pointer pSVar3;
  long lVar4;
  pointer pSVar5;
  pointer pSVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar1 = this->cap;
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    uVar9 = 0x555555555555555;
  }
  lVar7 = (long)pos - (long)this->data_;
  pSVar3 = (pointer)operator_new(uVar9 * 0x18);
  *(_Optional_payload_base<unsigned_int> *)((long)pSVar3 + lVar7 + 0x10) =
       (args->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  pEVar2 = args->withExpr;
  *(undefined8 *)((long)pSVar3 + lVar7) = (args->operand).ptr;
  ((undefined8 *)((long)pSVar3 + lVar7))[1] = pEVar2;
  p = this->data_;
  sVar8 = this->len;
  lVar4 = (long)p + (sVar8 * 0x18 - (long)pos);
  pSVar5 = p;
  pSVar6 = pSVar3;
  if (lVar4 == 0) {
    pSVar5 = pSVar3;
    pSVar6 = p;
    if (sVar8 != 0) {
      do {
        (pSVar5->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (pSVar6->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        pEVar2 = pSVar6->withExpr;
        (pSVar5->operand).ptr = (pSVar6->operand).ptr;
        pSVar5->withExpr = pEVar2;
        pSVar6 = pSVar6 + 1;
        pSVar5 = pSVar5 + 1;
      } while (pSVar6 != pos);
    }
  }
  else {
    for (; pSVar5 != pos; pSVar5 = pSVar5 + 1) {
      (pSVar6->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (pSVar5->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>;
      pEVar2 = pSVar5->withExpr;
      (pSVar6->operand).ptr = (pSVar5->operand).ptr;
      pSVar6->withExpr = pEVar2;
      pSVar6 = pSVar6 + 1;
    }
    memcpy((void *)((long)pSVar3 + lVar7 + 0x18),pos,((lVar4 - 0x18U) / 0x18) * 0x18 + 0x18);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar8 = this->len;
  }
  this->len = sVar8 + 1;
  this->cap = uVar9;
  this->data_ = pSVar3;
  return (pointer)((long)pSVar3 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}